

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-stroker.c
# Opt level: O1

PVG_FT_Error ft_stroke_border_grow(PVG_FT_StrokeBorder border,PVG_FT_UInt new_points)

{
  PVG_FT_Byte *in_RAX;
  PVG_FT_Vector *pPVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = border->max_points;
  uVar2 = new_points + border->num_points;
  if (uVar3 < uVar2) {
    do {
      uVar3 = uVar3 + (uVar3 >> 1) + 0x10;
    } while (uVar3 < uVar2);
    pPVar1 = (PVG_FT_Vector *)realloc(border->points,(ulong)uVar3 << 4);
    border->points = pPVar1;
    in_RAX = (PVG_FT_Byte *)realloc(border->tags,(ulong)uVar3);
    border->tags = in_RAX;
    if ((in_RAX != (PVG_FT_Byte *)0x0) && (border->points != (PVG_FT_Vector *)0x0)) {
      border->max_points = uVar3;
    }
  }
  return (PVG_FT_Error)in_RAX;
}

Assistant:

static PVG_FT_Error ft_stroke_border_grow(PVG_FT_StrokeBorder border,
                                         PVG_FT_UInt         new_points)
{
    PVG_FT_UInt  old_max = border->max_points;
    PVG_FT_UInt  new_max = border->num_points + new_points;
    PVG_FT_Error error = 0;

    if (new_max > old_max) {
        PVG_FT_UInt cur_max = old_max;

        while (cur_max < new_max) cur_max += (cur_max >> 1) + 16;

        border->points = (PVG_FT_Vector*)realloc(border->points,
                                                cur_max * sizeof(PVG_FT_Vector));
        border->tags =
            (PVG_FT_Byte*)realloc(border->tags, cur_max * sizeof(PVG_FT_Byte));

        if (!border->points || !border->tags) goto Exit;

        border->max_points = cur_max;
    }

Exit:
    return error;
}